

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

int Ssw_SmlNodeCountOnesReal(Ssw_Sml_t *p,Aig_Obj_t *pObj)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  uint *puVar5;
  int local_28;
  int local_24;
  int Counter;
  int i;
  uint *pSims;
  Aig_Obj_t *pObj_local;
  Ssw_Sml_t *p_local;
  
  local_28 = 0;
  pAVar4 = Aig_Regular(pObj);
  puVar5 = Ssw_ObjSim(p,pAVar4->Id);
  pAVar4 = Aig_Regular(pObj);
  uVar1 = *(ulong *)&pAVar4->field_0x18;
  uVar2 = Aig_IsComplement(pObj);
  if (((uint)(uVar1 >> 3) & 1) == uVar2) {
    for (local_24 = 0; local_24 < p->nWordsTotal; local_24 = local_24 + 1) {
      iVar3 = Aig_WordCountOnes(puVar5[local_24]);
      local_28 = iVar3 + local_28;
    }
  }
  else {
    for (local_24 = 0; local_24 < p->nWordsTotal; local_24 = local_24 + 1) {
      iVar3 = Aig_WordCountOnes(puVar5[local_24] ^ 0xffffffff);
      local_28 = iVar3 + local_28;
    }
  }
  return local_28;
}

Assistant:

int Ssw_SmlNodeCountOnesReal( Ssw_Sml_t * p, Aig_Obj_t * pObj )
{
    unsigned * pSims;
    int i, Counter = 0;
    pSims = Ssw_ObjSim(p, Aig_Regular(pObj)->Id);
    if ( Aig_Regular(pObj)->fPhase ^ Aig_IsComplement(pObj) )
    {
        for ( i = 0; i < p->nWordsTotal; i++ )
            Counter += Aig_WordCountOnes( ~pSims[i] );
    }
    else
    {
        for ( i = 0; i < p->nWordsTotal; i++ )
            Counter += Aig_WordCountOnes( pSims[i] );
    }
    return Counter;
}